

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O1

bool ProduceSignature(SigningProvider *provider,BaseSignatureCreator *creator,CScript *fromPubKey,
                     SignatureData *sigdata)

{
  CScript *scriptSig;
  byte bVar1;
  pointer puVar2;
  pointer pvVar3;
  pointer pbVar4;
  bool bVar5;
  bool bVar6;
  Availability AVar7;
  int iVar8;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this;
  undefined4 extraout_var;
  uint uVar9;
  uint uVar10;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar11;
  direct_or_indirect *pdVar12;
  pointer pvVar13;
  valtype *v;
  pointer pvVar14;
  long in_FS_OFFSET;
  bool bVar15;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  NodeRef<typename_WshSatisfier::Key> ms;
  TxoutType subType_1;
  TxoutType whichType;
  CScript witnessscript;
  TxoutType subType;
  CScript subscript;
  iterator local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  TxoutType local_d0;
  TxoutType local_cc;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_c8;
  undefined1 local_a8 [28];
  uint uStack_8c;
  MiniscriptContext local_88;
  direct_or_indirect local_78;
  uint local_5c;
  direct_or_indirect local_58;
  size_type sStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = true;
  if (sigdata->complete == false) {
    local_c8.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar5 = SignStep(provider,creator,fromPubKey,&local_c8,&local_cc,BASE,sigdata);
    local_58._16_4_ = 0;
    local_58._20_4_ = 0;
    local_58._24_4_ = 0;
    sStack_3c = 0;
    bVar15 = local_cc != SCRIPTHASH;
    local_58.indirect_contents.indirect = (char *)0x0;
    local_58.indirect_contents.capacity = 0;
    local_58._12_4_ = 0;
    bVar6 = bVar5;
    if (!bVar15 && bVar5) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::
      prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )((local_c8.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )((local_c8.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish);
      if (0x1c < sStack_3c) {
        free(local_58.indirect_contents.indirect);
      }
      local_58._16_4_ = local_a8._16_4_;
      local_58._20_4_ = local_a8._20_4_;
      local_58._24_4_ = local_a8._24_4_;
      local_58.indirect_contents.indirect = (char *)local_a8._0_8_;
      local_58.indirect_contents.capacity = local_a8._8_4_;
      local_58._12_4_ = local_a8._12_4_;
      sStack_3c = uStack_8c;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                (&(sigdata->redeem_script).super_CScriptBase,
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents);
      bVar6 = SignStep(provider,creator,(CScript *)&local_58.indirect_contents,&local_c8,&local_cc,
                       BASE,sigdata);
      bVar6 = bVar6 && local_cc != SCRIPTHASH;
    }
    uVar10 = (uint)bVar6;
    if ((local_cc == WITNESS_V0_KEYHASH & bVar6) == 1) {
      local_a8._16_4_ = 0;
      local_a8._20_4_ = 0;
      local_a8._24_4_ = 0;
      uStack_8c = 0;
      local_a8._0_8_ = (direct_or_indirect *)0x0;
      local_a8._8_4_ = 0;
      local_a8._12_4_ = 0;
      local_78.direct[0] = 'v';
      prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 &((direct_or_indirect *)local_a8)->indirect_contents,(iterator)local_a8,
                 (uchar *)local_78.direct);
      pdVar12 = (direct_or_indirect *)local_a8._0_8_;
      uVar10 = uStack_8c - 0x1d;
      if (uStack_8c < 0x1d) {
        pdVar12 = (direct_or_indirect *)local_a8;
        uVar10 = uStack_8c;
      }
      local_78.direct[0] = 0xa9;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 &((direct_or_indirect *)local_a8)->indirect_contents,
                 (uchar *)((long)&(pdVar12->indirect_contents).indirect + (long)(int)uVar10),
                 (uchar *)local_78.direct);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78.indirect_contents,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )((local_c8.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )((local_c8.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish,(allocator_type *)&local_e0);
      b._M_extent._M_extent_value = local_78._8_8_ - local_78._0_8_;
      b._M_ptr = (pointer)local_78.indirect_contents.indirect;
      this = &CScript::operator<<((CScript *)local_a8,b)->super_CScriptBase;
      uVar10 = this->_size;
      uVar9 = uVar10 - 0x1d;
      if (uVar10 < 0x1d) {
        uVar9 = uVar10;
      }
      ppVar11 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                (this->_union).indirect_contents.indirect;
      if (uVar10 < 0x1d) {
        ppVar11 = this;
      }
      local_e0.ptr._0_1_ = (allocator_type)0x88;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                (this,(uchar *)((long)&ppVar11->_union + (long)(int)uVar9),(uchar *)&local_e0);
      uVar10 = this->_size;
      uVar9 = uVar10 - 0x1d;
      if (uVar10 < 0x1d) {
        uVar9 = uVar10;
      }
      ppVar11 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                (this->_union).indirect_contents.indirect;
      if (uVar10 < 0x1d) {
        ppVar11 = this;
      }
      local_e0.ptr._0_1_ = (allocator_type)0xac;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                (this,(uchar *)((long)&ppVar11->_union + (long)(int)uVar9),(uchar *)&local_e0);
      if ((direct_or_indirect *)local_78.indirect_contents.indirect != (direct_or_indirect *)0x0) {
        operator_delete(local_78.indirect_contents.indirect,local_78._16_8_ - local_78._0_8_);
      }
      bVar6 = SignStep(provider,creator,(CScript *)local_a8,&local_c8,(TxoutType *)local_78.direct,
                       WITNESS_V0,sigdata);
      uVar10 = (uint)bVar6;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator=(&(sigdata->scriptWitness).stack,&local_c8);
      pvVar14 = local_c8.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pvVar3 = local_c8.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sigdata->witness = true;
      pvVar13 = local_c8.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_c8.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_c8.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          puVar2 = (pvVar13->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (puVar2 != (pointer)0x0) {
            operator_delete(puVar2,(long)(pvVar13->
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)puVar2);
          }
          pvVar13 = pvVar13 + 1;
        } while (pvVar13 != pvVar14);
        local_c8.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pvVar3;
      }
      local_a8._8_8_ = (SignatureData *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
      local_a8._16_8_ = (BaseSignatureCreator *)CONCAT44(local_a8._20_4_,local_a8._16_4_);
      unique0x1000152b = (direct_or_indirect *)CONCAT44(uStack_8c,local_a8._24_4_);
      if (0x1c < uStack_8c) {
        free((void *)local_a8._0_8_);
        local_a8._0_8_ = (direct_or_indirect *)0x0;
        local_a8._8_8_ = (SignatureData *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
        local_a8._16_8_ = (BaseSignatureCreator *)CONCAT44(local_a8._20_4_,local_a8._16_4_);
        unique0x10001533 = (direct_or_indirect *)CONCAT44(uStack_8c,local_a8._24_4_);
      }
    }
    else if ((local_cc == WITNESS_V0_SCRIPTHASH & bVar6) == 1) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::
      prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_78.indirect_contents,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )((local_c8.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )((local_c8.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                (&(sigdata->witness_script).super_CScriptBase,
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_78.indirect_contents);
      local_d0 = NONSTANDARD;
      bVar6 = SignStep(provider,creator,(CScript *)&local_78.indirect_contents,&local_c8,&local_d0,
                       WITNESS_V0,sigdata);
      if (bVar6) {
        uVar10 = 1;
        if (local_d0 < WITNESS_V1_TAPROOT) {
          uVar10 = 0x6f >> ((byte)local_d0 & 0x1f);
        }
      }
      else {
        uVar10 = 0;
      }
      local_a8._8_8_ = (SignatureData *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
      local_a8._16_8_ = (BaseSignatureCreator *)CONCAT44(local_a8._20_4_,local_a8._16_4_);
      unique0x100014bb = (direct_or_indirect *)CONCAT44(uStack_8c,local_a8._24_4_);
      if (((uVar10 & 1) == 0) &&
         (local_a8._8_8_ = (SignatureData *)CONCAT44(local_a8._12_4_,local_a8._8_4_),
         local_a8._16_8_ = (BaseSignatureCreator *)CONCAT44(local_a8._20_4_,local_a8._16_4_),
         unique0x100014c3 = (direct_or_indirect *)CONCAT44(uStack_8c,local_a8._24_4_),
         local_c8.
         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         local_c8.
         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)) {
        local_88 = P2WSH;
        local_a8._0_8_ = provider;
        local_a8._8_8_ = sigdata;
        local_a8._16_8_ = creator;
        unique0x10001493 = &local_78;
        miniscript::FromScript<WshSatisfier>
                  ((miniscript *)&local_e0,(CScript *)&local_78.indirect_contents,
                   (WshSatisfier *)local_a8);
        if ((Node<CPubKey> *)local_e0.ptr == (Node<CPubKey> *)0x0) {
          uVar10 = 0;
        }
        else {
          AVar7 = miniscript::Node<CPubKey>::Satisfy<WshSatisfier>
                            ((Node<CPubKey> *)local_e0.ptr,(WshSatisfier *)local_a8,&local_c8,true);
          uVar10 = (uint)(AVar7 == YES);
        }
        if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
        }
      }
      local_a8._0_8_ = &local_78;
      if (0x1c < local_5c) {
        local_a8._0_8_ = local_78.indirect_contents.indirect;
      }
      uVar9 = local_5c - 0x1d;
      if (0x1c >= local_5c) {
        uVar9 = local_5c;
      }
      local_e0.ptr = (uchar *)((long)&((anon_struct_12_2_7229fdc5_for_indirect_contents *)
                                      local_a8._0_8_)->indirect + (long)(int)uVar9);
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::
      emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
                ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  *)&local_c8,(iterator *)local_a8,&local_e0);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator=(&(sigdata->scriptWitness).stack,&local_c8);
      pvVar14 = local_c8.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pvVar3 = local_c8.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sigdata->witness = true;
      pvVar13 = local_c8.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_c8.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_c8.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          puVar2 = (pvVar13->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (puVar2 != (pointer)0x0) {
            operator_delete(puVar2,(long)(pvVar13->
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)puVar2);
          }
          pvVar13 = pvVar13 + 1;
        } while (pvVar13 != pvVar14);
        local_c8.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pvVar3;
      }
      if (0x1c < local_5c) {
        free(local_78.indirect_contents.indirect);
        local_78.indirect_contents.indirect = (char *)0x0;
      }
    }
    else if (local_cc == WITNESS_V1_TAPROOT && (bVar15 || !bVar5)) {
      sigdata->witness = true;
      if (bVar6 != false) {
        local_a8._0_8_ =
             (sigdata->scriptWitness).stack.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        pvVar14 = (sigdata->scriptWitness).stack.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pvVar3 = (sigdata->scriptWitness).stack.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (sigdata->scriptWitness).stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_c8.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (sigdata->scriptWitness).stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_c8.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (sigdata->scriptWitness).stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_c8.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_c8.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_a8._16_4_ = SUB84(pvVar3,0);
        local_a8._20_4_ = (undefined4)((ulong)pvVar3 >> 0x20);
        local_c8.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8._8_4_ = SUB84(pvVar14,0);
        local_a8._12_4_ = (undefined4)((ulong)pvVar14 >> 0x20);
        local_c8.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)local_a8);
      }
      pvVar14 = local_c8.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pvVar3 = local_c8.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar13 = local_c8.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_c8.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_c8.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          puVar2 = (pvVar13->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (puVar2 != (pointer)0x0) {
            operator_delete(puVar2,(long)(pvVar13->
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)puVar2);
          }
          pvVar13 = pvVar13 + 1;
        } while (pvVar13 != pvVar14);
        local_c8.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pvVar3;
      }
    }
    else {
      local_a8._8_8_ = (SignatureData *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
      local_a8._16_8_ = (BaseSignatureCreator *)CONCAT44(local_a8._20_4_,local_a8._16_4_);
      unique0x1000154b = (direct_or_indirect *)CONCAT44(uStack_8c,local_a8._24_4_);
      if ((local_cc == WITNESS_UNKNOWN & bVar6) == 1) {
        sigdata->witness = true;
        local_a8._8_8_ = (SignatureData *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
        local_a8._16_8_ = (BaseSignatureCreator *)CONCAT44(local_a8._20_4_,local_a8._16_4_);
        unique0x10001553 = (direct_or_indirect *)CONCAT44(uStack_8c,local_a8._24_4_);
      }
    }
    if (sigdata->witness == false) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::_M_erase_at_end(&(sigdata->scriptWitness).stack,
                        (sigdata->scriptWitness).stack.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    }
    if (!bVar15 && bVar5) {
      local_a8._0_8_ = &local_58;
      if (0x1c < sStack_3c) {
        local_a8._0_8_ = local_58.indirect_contents.indirect;
      }
      uVar9 = sStack_3c - 0x1d;
      if (0x1c >= sStack_3c) {
        uVar9 = sStack_3c;
      }
      local_78.indirect_contents.indirect =
           (char *)((long)&((anon_struct_12_2_7229fdc5_for_indirect_contents *)local_a8._0_8_)->
                           indirect + (long)(int)uVar9);
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::
      emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
                ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  *)&local_c8,(iterator *)local_a8,(iterator *)&local_78.indirect_contents);
    }
    pvVar3 = local_c8.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_a8._16_4_ = 0;
    local_a8._20_4_ = 0;
    local_a8._24_4_ = 0;
    uStack_8c = 0;
    local_a8._0_8_ = (direct_or_indirect *)0x0;
    local_a8._8_4_ = 0;
    local_a8._12_4_ = 0;
    if (local_c8.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_c8.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pvVar14 = local_c8.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pbVar4 = (pvVar14->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        b_00._M_extent._M_extent_value =
             (long)(pvVar14->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pbVar4;
        if (b_00._M_extent._M_extent_value == 0) {
          uVar9 = uStack_8c - 0x1d;
          if (uStack_8c < 0x1d) {
            uVar9 = uStack_8c;
          }
          pdVar12 = (direct_or_indirect *)local_a8._0_8_;
          if (uStack_8c < 0x1d) {
            pdVar12 = (direct_or_indirect *)local_a8;
          }
          local_78.indirect_contents.indirect = (char *)((ulong)(uint7)local_78._1_7_ << 8);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                     &((direct_or_indirect *)local_a8)->indirect_contents,
                     (uchar *)((long)&(pdVar12->indirect_contents).indirect + (long)(int)uVar9),
                     (uchar *)local_78.direct);
        }
        else if (b_00._M_extent._M_extent_value == 1) {
          bVar1 = *pbVar4;
          if ((byte)(bVar1 - 1) < 0x10) {
            CScript::operator<<((CScript *)&((direct_or_indirect *)local_a8)->indirect_contents,
                                bVar1 + OP_RESERVED);
          }
          else {
            if (bVar1 != 0x81) goto LAB_00191bef;
            uVar9 = uStack_8c - 0x1d;
            if (uStack_8c < 0x1d) {
              uVar9 = uStack_8c;
            }
            pdVar12 = (direct_or_indirect *)local_a8._0_8_;
            if (uStack_8c < 0x1d) {
              pdVar12 = (direct_or_indirect *)local_a8;
            }
            local_78.direct[0] = 0x4f;
            prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                       &((direct_or_indirect *)local_a8)->indirect_contents,
                       (uchar *)((long)&(pdVar12->indirect_contents).indirect + (long)(int)uVar9),
                       (uchar *)local_78.direct);
          }
        }
        else {
LAB_00191bef:
          b_00._M_ptr = pbVar4;
          CScript::operator<<((CScript *)&((direct_or_indirect *)local_a8)->indirect_contents,b_00);
        }
        pvVar14 = pvVar14 + 1;
      } while (pvVar14 != pvVar3);
    }
    scriptSig = &sigdata->scriptSig;
    if (0x1c < (sigdata->scriptSig).super_CScriptBase._size) {
      free((scriptSig->super_CScriptBase)._union.indirect_contents.indirect);
    }
    *(ulong *)((long)&(sigdata->scriptSig).super_CScriptBase._union + 0xc) =
         CONCAT44(local_a8._16_4_,local_a8._12_4_);
    *(ulong *)((long)&(sigdata->scriptSig).super_CScriptBase._union + 0x14) =
         CONCAT44(local_a8._24_4_,local_a8._20_4_);
    *(undefined4 *)&(scriptSig->super_CScriptBase)._union = local_a8._0_4_;
    *(undefined4 *)((long)&(sigdata->scriptSig).super_CScriptBase._union + 4) = local_a8._4_4_;
    (sigdata->scriptSig).super_CScriptBase._union.indirect_contents.capacity = local_a8._8_4_;
    *(undefined4 *)((long)&(sigdata->scriptSig).super_CScriptBase._union + 0xc) = local_a8._12_4_;
    (sigdata->scriptSig).super_CScriptBase._size = uStack_8c;
    if ((uVar10 & 1) == 0) {
      bVar6 = false;
    }
    else {
      iVar8 = (*creator->_vptr_BaseSignatureCreator[2])();
      bVar6 = VerifyScript(scriptSig,fromPubKey,&sigdata->scriptWitness,0x1fffdf,
                           (BaseSignatureChecker *)CONCAT44(extraout_var,iVar8),(ScriptError *)0x0);
    }
    sigdata->complete = bVar6;
    if (0x1c < sStack_3c) {
      free(local_58.indirect_contents.indirect);
      local_58.indirect_contents.indirect = (char *)0x0;
    }
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector(&local_c8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool ProduceSignature(const SigningProvider& provider, const BaseSignatureCreator& creator, const CScript& fromPubKey, SignatureData& sigdata)
{
    if (sigdata.complete) return true;

    std::vector<valtype> result;
    TxoutType whichType;
    bool solved = SignStep(provider, creator, fromPubKey, result, whichType, SigVersion::BASE, sigdata);
    bool P2SH = false;
    CScript subscript;

    if (solved && whichType == TxoutType::SCRIPTHASH)
    {
        // Solver returns the subscript that needs to be evaluated;
        // the final scriptSig is the signatures from that
        // and then the serialized subscript:
        subscript = CScript(result[0].begin(), result[0].end());
        sigdata.redeem_script = subscript;
        solved = solved && SignStep(provider, creator, subscript, result, whichType, SigVersion::BASE, sigdata) && whichType != TxoutType::SCRIPTHASH;
        P2SH = true;
    }

    if (solved && whichType == TxoutType::WITNESS_V0_KEYHASH)
    {
        CScript witnessscript;
        witnessscript << OP_DUP << OP_HASH160 << ToByteVector(result[0]) << OP_EQUALVERIFY << OP_CHECKSIG;
        TxoutType subType;
        solved = solved && SignStep(provider, creator, witnessscript, result, subType, SigVersion::WITNESS_V0, sigdata);
        sigdata.scriptWitness.stack = result;
        sigdata.witness = true;
        result.clear();
    }
    else if (solved && whichType == TxoutType::WITNESS_V0_SCRIPTHASH)
    {
        CScript witnessscript(result[0].begin(), result[0].end());
        sigdata.witness_script = witnessscript;

        TxoutType subType{TxoutType::NONSTANDARD};
        solved = solved && SignStep(provider, creator, witnessscript, result, subType, SigVersion::WITNESS_V0, sigdata) && subType != TxoutType::SCRIPTHASH && subType != TxoutType::WITNESS_V0_SCRIPTHASH && subType != TxoutType::WITNESS_V0_KEYHASH;

        // If we couldn't find a solution with the legacy satisfier, try satisfying the script using Miniscript.
        // Note we need to check if the result stack is empty before, because it might be used even if the Script
        // isn't fully solved. For instance the CHECKMULTISIG satisfaction in SignStep() pushes partial signatures
        // and the extractor relies on this behaviour to combine witnesses.
        if (!solved && result.empty()) {
            WshSatisfier ms_satisfier{provider, sigdata, creator, witnessscript};
            const auto ms = miniscript::FromScript(witnessscript, ms_satisfier);
            solved = ms && ms->Satisfy(ms_satisfier, result) == miniscript::Availability::YES;
        }
        result.emplace_back(witnessscript.begin(), witnessscript.end());

        sigdata.scriptWitness.stack = result;
        sigdata.witness = true;
        result.clear();
    } else if (whichType == TxoutType::WITNESS_V1_TAPROOT && !P2SH) {
        sigdata.witness = true;
        if (solved) {
            sigdata.scriptWitness.stack = std::move(result);
        }
        result.clear();
    } else if (solved && whichType == TxoutType::WITNESS_UNKNOWN) {
        sigdata.witness = true;
    }

    if (!sigdata.witness) sigdata.scriptWitness.stack.clear();
    if (P2SH) {
        result.emplace_back(subscript.begin(), subscript.end());
    }
    sigdata.scriptSig = PushAll(result);

    // Test solution
    sigdata.complete = solved && VerifyScript(sigdata.scriptSig, fromPubKey, &sigdata.scriptWitness, STANDARD_SCRIPT_VERIFY_FLAGS, creator.Checker());
    return sigdata.complete;
}